

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O1

LY_ERR ly_checkutf8(char *input,size_t in_len,size_t *utf8_len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  bVar1 = *input;
  if ((char)bVar1 < '\0') {
    if (in_len < 2 || (bVar1 & 0xe0) != 0xc0) {
      if (in_len < 3 || (bVar1 & 0xf0) != 0xe0) {
        if (in_len < 4 || (bVar1 & 0xf8) != 0xf0) {
          return LY_EINVAL;
        }
        iVar2 = ly_utf8_less(input,4,0xf0,0x90,0x80,0x80);
        if (iVar2 != 0) {
          return LY_EINVAL;
        }
        iVar2 = ly_utf8_greater(input,4,0xf4,0x8f,0xbf,0xbf);
        if (iVar2 != 0) {
          return LY_EINVAL;
        }
        uVar3 = ly_utf8_and_equal(input,4,0xf8,0xf0,0xc0,0x80,0xc0,0x80,0xc0,0x80);
        sVar4 = 4;
      }
      else {
        iVar2 = ly_utf8_less(input,3,0xed,0xa0,0x80);
        if ((iVar2 == 0) && (iVar2 = ly_utf8_greater(input,3,0xed,0xbf,0xbf), iVar2 == 0)) {
          return LY_EINVAL;
        }
        iVar2 = ly_utf8_less(input,3,0xe0,0xa0,0x80);
        if (iVar2 != 0) {
          return LY_EINVAL;
        }
        iVar2 = ly_utf8_greater(input,3,0xef,0xbf,0xbf);
        if (iVar2 != 0) {
          return LY_EINVAL;
        }
        uVar3 = ly_utf8_and_equal(input,3,0xf0,0xe0,0xc0,0x80,0xc0,0x80);
        sVar4 = 3;
      }
    }
    else {
      iVar2 = ly_utf8_less(input,2,0xc2,0x80);
      if (iVar2 != 0) {
        return LY_EINVAL;
      }
      iVar2 = ly_utf8_greater(input,2,0xdf,0xbf);
      if (iVar2 != 0) {
        return LY_EINVAL;
      }
      uVar3 = ly_utf8_and_equal(input,2,0xe0,0xc0,0xc0,0x80);
      sVar4 = 2;
    }
  }
  else {
    iVar2 = ly_utf8_less(input,1,0x20);
    sVar4 = 1;
    if (iVar2 == 0) goto LAB_0010eca9;
    if (0xd < (byte)*input) {
      return LY_EINVAL;
    }
    uVar3 = 0x2600U >> ((byte)*input & 0x1f) & 1;
  }
  if (uVar3 == 0) {
    return LY_EINVAL;
  }
LAB_0010eca9:
  *utf8_len = sVar4;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
ly_checkutf8(const char *input, size_t in_len, size_t *utf8_len)
{
    size_t len;

    if (!(input[0] & 0x80)) {
        /* one byte character */
        len = 1;

        if (ly_utf8_less(input, 1, 0x20) && (input[0] != 0x9) && (input[0] != 0xa) && (input[0] != 0xd)) {
            /* invalid control characters */
            return LY_EINVAL;
        }
    } else if (((input[0] & 0xe0) == 0xc0) && (in_len > 1)) {
        /* two bytes character */
        len = 2;

        /* (input < 0xC280) || (input > 0xDFBF) || ((input & 0xE0C0) != 0xC080) */
        if (ly_utf8_less(input, 2, 0xC2, 0x80) || ly_utf8_greater(input, 2, 0xDF, 0xBF) ||
                !ly_utf8_and_equal(input, 2, 0xE0, 0xC0, 0xC0, 0x80)) {
            return LY_EINVAL;
        }
    } else if (((input[0] & 0xf0) == 0xe0) && (in_len > 2)) {
        /* three bytes character */
        len = 3;

        /* (input >= 0xEDA080) && (input <= 0xEDBFBF) */
        if (!ly_utf8_less(input, 3, 0xED, 0xA0, 0x80) && !ly_utf8_greater(input, 3, 0xED, 0xBF, 0xBF)) {
            /* reject UTF-16 surrogates */
            return LY_EINVAL;
        }

        /* (input < 0xE0A080) || (input > 0xEFBFBF) || ((input & 0xF0C0C0) != 0xE08080) */
        if (ly_utf8_less(input, 3, 0xE0, 0xA0, 0x80) || ly_utf8_greater(input, 3, 0xEF, 0xBF, 0xBF) ||
                !ly_utf8_and_equal(input, 3, 0xF0, 0xE0, 0xC0, 0x80, 0xC0, 0x80)) {
            return LY_EINVAL;
        }
    } else if (((input[0] & 0xf8) == 0xf0) && (in_len > 3)) {
        /* four bytes character */
        len = 4;

        /* (input < 0xF0908080) || (input > 0xF48FBFBF) || ((input & 0xF8C0C0C0) != 0xF0808080) */
        if (ly_utf8_less(input, 4, 0xF0, 0x90, 0x80, 0x80) || ly_utf8_greater(input, 4, 0xF4, 0x8F, 0xBF, 0xBF) ||
                !ly_utf8_and_equal(input, 4, 0xF8, 0xF0, 0xC0, 0x80, 0xC0, 0x80, 0xC0, 0x80)) {
            return LY_EINVAL;
        }
    } else {
        return LY_EINVAL;
    }

    *utf8_len = len;
    return LY_SUCCESS;
}